

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O2

void * duckdb_je_hpdata_reserve_alloc(hpdata_t *hpdata,size_t sz)

{
  fb_group_t *fb;
  size_t sVar1;
  _Bool _Var2;
  ulong uVar3;
  fb_group_t *cnt;
  uint uVar4;
  ulong uVar5;
  size_t *in_R8;
  ulong uVar6;
  size_t *psVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t begin;
  hpdata_t *local_48;
  size_t local_40;
  size_t len;
  
  begin = 0;
  len = 0;
  uVar10 = sz >> 0xc;
  fb = hpdata->active_pages;
  uVar5 = 0;
  sVar9 = 0;
  local_48 = hpdata;
  while (psVar7 = &len, fb_urange_iter(fb,sVar9,(size_t)&begin,&len,in_R8), sVar1 = len,
        sVar9 = begin, len < uVar10) {
    if (uVar5 < len) {
      uVar5 = len;
    }
    sVar9 = len + begin;
  }
  fb_set_range(fb,begin,uVar10,(size_t)psVar7);
  local_48->h_nactive = local_48->h_nactive + uVar10;
  uVar4 = (uint)sVar9 & 0x3f;
  uVar3 = 0x40 - (ulong)uVar4;
  if (uVar4 + uVar10 < 0x41) {
    uVar3 = uVar10;
  }
  local_40 = sVar9;
  cnt = local_48->touched_pages + (sVar9 >> 6) + 1;
  uVar6 = (0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU)) << (sbyte)uVar4 &
          local_48->touched_pages[sVar9 >> 6];
  uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
  uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
  psVar7 = (size_t *)0xf0f0f0f0f0f0f0f;
  uVar6 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
  for (uVar3 = uVar10 - uVar3; 0x40 < uVar3; uVar3 = uVar3 - 0x40) {
    uVar8 = *cnt - (*cnt >> 1 & 0x5555555555555555);
    uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
    uVar6 = uVar6 + (((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    cnt = cnt + 1;
  }
  if (uVar3 != 0) {
    uVar8 = *cnt;
    cnt = (fb_group_t *)(CONCAT71((int7)(uVar3 >> 8),-(char)uVar3) & 0xffffffff);
    uVar3 = (uVar8 << ((byte)cnt & 0x3f)) >> ((byte)cnt & 0x3f);
    uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
    uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
    uVar6 = uVar6 + (((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  fb_set_range(local_48->touched_pages,sVar9,uVar10,(size_t)cnt);
  local_48->h_ntouched = local_48->h_ntouched + (uVar10 - uVar6);
  if (sVar1 == local_48->h_longest_free_range) {
    uVar10 = uVar10 + sVar9;
    while (((uVar3 = uVar5, uVar10 < 0x200 &&
            (_Var2 = fb_urange_iter(fb,uVar10,(size_t)&begin,&len,psVar7), sVar9 = local_40, _Var2))
           && (uVar3 = sVar1, len != sVar1))) {
      if (uVar5 < len) {
        uVar5 = len;
      }
      uVar10 = len + begin;
    }
    local_48->h_longest_free_range = uVar3;
  }
  return (void *)(sVar9 * 0x1000 + (long)local_48->h_address);
}

Assistant:

void *
hpdata_reserve_alloc(hpdata_t *hpdata, size_t sz) {
	hpdata_assert_consistent(hpdata);
	/*
	 * This is a metadata change; the hpdata should therefore either not be
	 * in the psset, or should have explicitly marked itself as being
	 * mid-update.
	 */
	assert(!hpdata->h_in_psset || hpdata->h_updating);
	assert(hpdata->h_alloc_allowed);
	assert((sz & PAGE_MASK) == 0);
	size_t npages = sz >> LG_PAGE;
	assert(npages <= hpdata_longest_free_range_get(hpdata));

	size_t result;

	size_t start = 0;
	/*
	 * These are dead stores, but the compiler will issue warnings on them
	 * since it can't tell statically that found is always true below.
	 */
	size_t begin = 0;
	size_t len = 0;

	size_t largest_unchosen_range = 0;
	while (true) {
		bool found = fb_urange_iter(hpdata->active_pages,
		    HUGEPAGE_PAGES, start, &begin, &len);
		/*
		 * A precondition to this function is that hpdata must be able
		 * to serve the allocation.
		 */
		assert(found);
		assert(len <= hpdata_longest_free_range_get(hpdata));
		if (len >= npages) {
			/*
			 * We use first-fit within the page slabs; this gives
			 * bounded worst-case fragmentation within a slab.  It's
			 * not necessarily right; we could experiment with
			 * various other options.
			 */
			break;
		}
		if (len > largest_unchosen_range) {
			largest_unchosen_range = len;
		}
		start = begin + len;
	}
	/* We found a range; remember it. */
	result = begin;
	fb_set_range(hpdata->active_pages, HUGEPAGE_PAGES, begin, npages);
	hpdata->h_nactive += npages;

	/*
	 * We might be about to dirty some memory for the first time; update our
	 * count if so.
	 */
	size_t new_dirty = fb_ucount(hpdata->touched_pages,  HUGEPAGE_PAGES,
	    result, npages);
	fb_set_range(hpdata->touched_pages, HUGEPAGE_PAGES, result, npages);
	hpdata->h_ntouched += new_dirty;

	/*
	 * If we allocated out of a range that was the longest in the hpdata, it
	 * might be the only one of that size and we'll have to adjust the
	 * metadata.
	 */
	if (len == hpdata_longest_free_range_get(hpdata)) {
		start = begin + npages;
		while (start < HUGEPAGE_PAGES) {
			bool found = fb_urange_iter(hpdata->active_pages,
			    HUGEPAGE_PAGES, start, &begin, &len);
			if (!found) {
				break;
			}
			assert(len <= hpdata_longest_free_range_get(hpdata));
			if (len == hpdata_longest_free_range_get(hpdata)) {
				largest_unchosen_range = len;
				break;
			}
			if (len > largest_unchosen_range) {
				largest_unchosen_range = len;
			}
			start = begin + len;
		}
		hpdata_longest_free_range_set(hpdata, largest_unchosen_range);
	}

	hpdata_assert_consistent(hpdata);
	return (void *)(
	    (byte_t *)hpdata_addr_get(hpdata) + (result << LG_PAGE));
}